

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

void __thiscall re2::Regexp::ParseState::DoCollapse(ParseState *this,RegexpOp op)

{
  ushort uVar1;
  bool bVar2;
  RegexpOp RVar3;
  Regexp **sub;
  Regexp *pRVar4;
  ParseState *pPVar5;
  uint uVar6;
  StringPiece *pSVar7;
  ParseState *pPVar8;
  ParseState *re;
  ulong uVar9;
  Regexp **ppRVar10;
  uint nsub;
  
  re = (ParseState *)this->stacktop_;
  nsub = 0;
  pPVar5 = re;
  pPVar8 = (ParseState *)0x0;
  while ((pPVar5 != (ParseState *)0x0 &&
         (RVar3 = (RegexpOp)(byte)(char)pPVar5->flags_, RVar3 < (kRegexpCharClass|kRegexpEmptyMatch)
         ))) {
    uVar6 = 1;
    if (RVar3 == op) {
      uVar6 = (uint)*(ushort *)&pPVar5->field_0x6;
    }
    pPVar5 = (ParseState *)
             ((anon_union_8_2_3df47e5c_for_Regexp_7 *)&pPVar5->whole_regexp_)[1].submany_;
    nsub = nsub + uVar6;
    pPVar8 = pPVar5;
  }
  if ((re == (ParseState *)0x0) ||
     ((ParseState *)((anon_union_8_2_3df47e5c_for_Regexp_7 *)&re->whole_regexp_)[1].submany_ !=
      pPVar8)) {
    pPVar8 = (ParseState *)((ulong)nsub << 3);
    sub = (Regexp **)operator_new__((ulong)pPVar8);
    pPVar5 = (ParseState *)0x0;
    uVar6 = nsub;
    while ((re != (ParseState *)0x0 &&
           (RVar3 = (RegexpOp)(byte)(char)re->flags_, RVar3 < (kRegexpCharClass|kRegexpEmptyMatch)))
          ) {
      pPVar5 = *(ParseState **)&(re->whole_regexp_).length_;
      if (RVar3 == op) {
        uVar1 = *(ushort *)&re->field_0x6;
        uVar9 = (ulong)uVar1;
        if (uVar1 < 2) {
          pSVar7 = &re->whole_regexp_;
        }
        else {
          pSVar7 = (StringPiece *)(re->whole_regexp_).ptr_;
        }
        ppRVar10 = sub + (long)(int)uVar6 + -1;
        uVar6 = uVar6 - uVar1;
        for (; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
          pRVar4 = Incref(*(Regexp **)((long)pSVar7 + uVar9 * 8 + -8));
          *ppRVar10 = pRVar4;
          ppRVar10 = ppRVar10 + -1;
        }
        Decref((Regexp *)re);
        pPVar8 = re;
        re = pPVar5;
      }
      else {
        FinishRegexp(pPVar8,(Regexp *)re);
        sub[(long)(int)uVar6 + -1] = (Regexp *)re;
        uVar6 = uVar6 - 1;
        re = pPVar5;
      }
    }
    pRVar4 = ConcatOrAlternate(op,sub,nsub,this->flags_,true);
    operator_delete__(sub);
    bVar2 = ComputeSimple(pRVar4);
    pRVar4->simple_ = bVar2;
    pRVar4->down_ = (Regexp *)pPVar5;
    this->stacktop_ = pRVar4;
  }
  return;
}

Assistant:

void Regexp::ParseState::DoCollapse(RegexpOp op) {
  // Scan backward to marker, counting children of composite.
  int n = 0;
  Regexp* next = NULL;
  Regexp* sub;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op)
      n += sub->nsub_;
    else
      n++;
  }

  // If there's just one child, leave it alone.
  // (Concat of one thing is that one thing; alternate of one thing is same.)
  if (stacktop_ != NULL && stacktop_->down_ == next)
    return;

  // Construct op (alternation or concatenation), flattening op of op.
  Regexp** subs = new Regexp*[n];
  next = NULL;
  int i = n;
  for (sub = stacktop_; sub != NULL && !IsMarker(sub->op()); sub = next) {
    next = sub->down_;
    if (sub->op_ == op) {
      Regexp** sub_subs = sub->sub();
      for (int k = sub->nsub_ - 1; k >= 0; k--)
        subs[--i] = sub_subs[k]->Incref();
      sub->Decref();
    } else {
      subs[--i] = FinishRegexp(sub);
    }
  }

  Regexp* re = ConcatOrAlternate(op, subs, n, flags_, true);
  delete[] subs;
  re->simple_ = re->ComputeSimple();
  re->down_ = next;
  stacktop_ = re;
}